

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_fflags_text(archive_entry *entry)

{
  wchar_t wVar1;
  archive_mstring *aes;
  int *piVar2;
  long in_RDI;
  unsigned_long unaff_retaddr;
  char *p;
  char *f;
  char **in_stack_ffffffffffffffd8;
  archive_mstring *in_stack_ffffffffffffffe0;
  archive *in_stack_ffffffffffffffe8;
  int retvalue;
  archive *local_8;
  
  wVar1 = archive_mstring_get_mbs
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (wVar1 == L'\0') {
    if (in_stack_ffffffffffffffe8 != (archive *)0x0) {
      return (char *)in_stack_ffffffffffffffe8;
    }
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx((int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffffe8);
    }
  }
  if ((*(long *)(in_RDI + 0x130) == 0) && (*(long *)(in_RDI + 0x138) == 0)) {
    local_8 = (archive *)0x0;
  }
  else {
    aes = (archive_mstring *)ae_fflagstostr((unsigned_long)p,unaff_retaddr);
    retvalue = (int)((ulong)in_RDI >> 0x20);
    if (aes == (archive_mstring *)0x0) {
      local_8 = (archive *)0x0;
    }
    else {
      archive_mstring_copy_mbs((archive_mstring *)in_stack_ffffffffffffffe8,(char *)aes);
      free(aes);
      wVar1 = archive_mstring_get_mbs(in_stack_ffffffffffffffe8,aes,in_stack_ffffffffffffffd8);
      local_8 = in_stack_ffffffffffffffe8;
      if (wVar1 != L'\0') {
        piVar2 = __errno_location();
        if (*piVar2 == 0xc) {
          __archive_errx(retvalue,(char *)in_stack_ffffffffffffffe8);
        }
        local_8 = (archive *)0x0;
      }
    }
  }
  return (char *)local_8;
}

Assistant:

const char *
archive_entry_fflags_text(struct archive_entry *entry)
{
	const char *f;
	char *p;

	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0) {
		if (f != NULL)
			return (f);
	} else if (errno == ENOMEM)
		__archive_errx(1, "No memory");

	if (entry->ae_fflags_set == 0  &&  entry->ae_fflags_clear == 0)
		return (NULL);

	p = ae_fflagstostr(entry->ae_fflags_set, entry->ae_fflags_clear);
	if (p == NULL)
		return (NULL);

	archive_mstring_copy_mbs(&entry->ae_fflags_text, p);
	free(p);
	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0)
		return (f);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}